

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats_publisher.cc
# Opt level: O0

void __thiscall StatsPublisher::publish(StatsPublisher *this,string *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this_00;
  int rv;
  int *in_stack_00000120;
  char (*in_stack_00000128) [2];
  char (*in_stack_00000130) [105];
  char (*in_stack_00000138) [29];
  Publisher *in_stack_ffffffffffffff90;
  FILE *__stream;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  bVar1 = Publisher::hasSubscribers(in_stack_ffffffffffffff90);
  if (bVar1) {
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    iVar2 = nn_send(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    if (iVar2 < 0) {
      __stream = _stderr;
      nn_errno();
      pcVar3 = nn_strerror(0);
      fprintf(__stream,"nn_send: %s\n",pcVar3);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[29],char[105],char[2],int>
                (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
      std::runtime_error::runtime_error(this_00,(string *)&stack0xffffffffffffffc8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StatsPublisher::publish(const std::string& str) {
  if (!hasSubscribers()) {
    return;
  }

  auto rv = nn_send(fd_, str.data(), str.size(), 0);
  if (rv < 0) {
    fprintf(stderr, "nn_send: %s\n", nn_strerror(nn_errno()));
    ASSERT(false);
  }
}